

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O3

Json __thiscall YdiskRestClient::get_disk_info(YdiskRestClient *this)

{
  string *psVar1;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  Client *this_00;
  YdiskRestClient *this_01;
  Json JVar3;
  string error;
  shared_ptr<httplib::Response> r;
  Json local_a8;
  string local_98;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _func_int **local_48;
  _Alloc_hider _Stack_40;
  code *local_38;
  undefined8 uStack_30;
  
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48 = (_func_int **)0x0;
  _Stack_40._M_p = (pointer)0x0;
  this_00 = (Client *)local_78;
  httplib::Client::Get
            (this_00,*(char **)(in_RSI + 8),(Headers *)"/v1/disk/",(Progress *)(in_RSI + 0x10));
  if (local_38 != (code *)0x0) {
    this_00 = (Client *)&stack0xffffffffffffffb8;
    (*local_38)(this_00,this_00,3);
  }
  if (((Response *)local_78._0_8_ != (Response *)0x0) && (*(int *)(local_78._0_8_ + 0x20) == 200)) {
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    json11::Json::parse((Json *)this,(string *)(local_78._0_8_ + 0x58),&local_98,STANDARD);
    local_a8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this->token;
    local_a8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->http_client;
    if ((SSLClient *)
        local_a8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (SSLClient *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(((SSLClient *)
                   local_a8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->super_Client).host_;
        *(int *)&(psVar1->_M_dataplus)._M_p = *(int *)&(psVar1->_M_dataplus)._M_p + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(((SSLClient *)
                   local_a8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->super_Client).host_;
        *(int *)&(psVar1->_M_dataplus)._M_p = *(int *)&(psVar1->_M_dataplus)._M_p + 1;
      }
    }
    this_01 = (YdiskRestClient *)(local_78 + 0x10);
    local_78._16_8_ = &local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this_01,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    check_parsing_result(this_01,&local_a8,(string *)(local_78 + 0x10));
    _Var2._M_pi = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._16_8_ != &local_58) {
      operator_delete((void *)local_78._16_8_,local_58._0_8_ + 1);
      _Var2._M_pi = extraout_RDX_00;
    }
    if ((SSLClient *)
        local_a8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (SSLClient *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var2._M_pi = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
      _Var2._M_pi = extraout_RDX_02;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      _Var2._M_pi = extraout_RDX_03;
    }
    JVar3.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var2._M_pi;
    JVar3.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Json)JVar3.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  throw_response_error((YdiskRestClient *)this_00,(Response *)local_78._0_8_);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

Json YdiskRestClient::get_disk_info()
{
    auto r = http_client->Get("/v1/disk/", headers);

    if(r.get() && r->status==200){
        std::string error;
        auto json = Json::parse(r->body, error);
        check_parsing_result(json, error);
        return json;
    } else {
        throw_response_error(r.get());
    }
}